

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

void Llb_MtrVerifyColumnsAll(Llb_Mtr_t *p)

{
  int local_1c;
  int local_18;
  int Counter;
  int iCol;
  int iRow;
  Llb_Mtr_t *p_local;
  
  Counter = 0;
  while( true ) {
    if (p->nRows <= Counter) {
      return;
    }
    local_1c = 0;
    for (local_18 = 0; local_18 < p->nCols; local_18 = local_18 + 1) {
      if (p->pMatrix[local_18][Counter] == '\x01') {
        local_1c = local_1c + 1;
      }
    }
    if (local_1c != p->pRowSums[Counter]) break;
    Counter = Counter + 1;
  }
  __assert_fail("Counter == p->pRowSums[iRow]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                ,100,"void Llb_MtrVerifyColumnsAll(Llb_Mtr_t *)");
}

Assistant:

void Llb_MtrVerifyColumnsAll( Llb_Mtr_t * p )
{
    int iRow, iCol, Counter;
    for ( iRow = 0; iRow < p->nRows; iRow++ )
    {
        Counter = 0;
        for ( iCol = 0; iCol < p->nCols; iCol++ )
            if ( p->pMatrix[iCol][iRow] == 1 )
                Counter++;
        assert( Counter == p->pRowSums[iRow] );
    }
}